

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall pugi::xml_node::remove_child(xml_node *this,xml_node *n)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_allocator *alloc;
  xml_node_struct *pxVar4;
  xml_node_struct **ppxVar5;
  xml_node_struct *pxVar6;
  
  pxVar1 = this->_root;
  if (((pxVar1 != (xml_node_struct *)0x0) && (pxVar2 = n->_root, pxVar2 != (xml_node_struct *)0x0))
     && (pxVar3 = pxVar2->parent, pxVar3 == pxVar1)) {
    alloc = *(xml_allocator **)((long)pxVar1 - (pxVar1->header >> 8));
    pxVar1 = pxVar2->prev_sibling_c;
    pxVar4 = pxVar2->next_sibling;
    pxVar6 = pxVar4;
    if (pxVar4 == (xml_node_struct *)0x0) {
      pxVar6 = pxVar3->first_child;
    }
    pxVar6->prev_sibling_c = pxVar1;
    ppxVar5 = &pxVar3->first_child;
    if (pxVar1->next_sibling != (xml_node_struct *)0x0) {
      ppxVar5 = &pxVar1->next_sibling;
    }
    *ppxVar5 = pxVar4;
    pxVar2->parent = (xml_node_struct *)0x0;
    pxVar2->prev_sibling_c = (xml_node_struct *)0x0;
    pxVar2->next_sibling = (xml_node_struct *)0x0;
    impl::anon_unknown_0::destroy_node(n->_root,alloc);
    return true;
  }
  return false;
}

Assistant:

PUGI_IMPL_FN bool xml_node::remove_child(const xml_node& n)
	{
		if (!_root || !n._root || n._root->parent != _root) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		impl::remove_node(n._root);
		impl::destroy_node(n._root, alloc);

		return true;
	}